

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

char * find_roman_suffix_start(char *buf)

{
  char *pcVar1;
  byte *pbVar2;
  uint uVar3;
  
  pcVar1 = strrchr(buf,0x20);
  if (pcVar1 != (char *)0x0) {
    pbVar2 = (byte *)(pcVar1 + 1);
    while( true ) {
      uVar3 = *pbVar2 - 0x43;
      if ((0x15 < uVar3) || ((0x280643U >> (uVar3 & 0x1f) & 1) == 0)) break;
      pbVar2 = pbVar2 + 1;
    }
    if (*pbVar2 == 0) {
      return (char *)(byte *)(pcVar1 + 1);
    }
  }
  return (char *)0x0;
}

Assistant:

char *find_roman_suffix_start(const char *buf)
{
	const char *start = strrchr(buf, ' ');
	const char *p;
	
	if (start) {
		start++;
		p = start;
		while (*p) {
			if (*p != 'I' && *p != 'V' && *p != 'X' && *p != 'L' &&
			    *p != 'C' && *p != 'D' && *p != 'M') {
				start = NULL;
				break;
			}
			++p;			    
		}
	}
	return (char *)start;
}